

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase885::run(TestCase885 *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  nfds_t __nfds;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  nfds_t __nfds_00;
  nfds_t __nfds_01;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  undefined8 extraout_RDX_02;
  nfds_t __nfds_02;
  bool local_46a;
  undefined1 auStack_468 [6];
  bool _kj_shouldLog_8;
  uint local_458;
  bool local_44f;
  DebugExpression<bool> local_44e;
  bool local_44d;
  int local_44c;
  DebugExpression<bool> _kjCondition_8;
  uint uStack_448;
  bool _kj_shouldLog_7;
  DebugExpression<int> local_444;
  undefined1 local_440 [8];
  DebugComparison<int,_int> _kjCondition_7;
  undefined1 uStack_418;
  bool _kj_shouldLog_6;
  DebugExpression<bool> _kjCondition_6;
  bool _kj_shouldLog_5;
  DebugExpression<bool> _kjCondition_5;
  bool local_3fa;
  int status_1;
  bool _kj_shouldLog_4;
  uint local_3e8;
  bool local_3dc;
  DebugExpression<bool> local_3db;
  bool local_3da;
  undefined1 auStack_3d8 [5];
  DebugExpression<bool> _kjCondition_4;
  bool _kj_shouldLog_3;
  uint local_3c8;
  bool local_3ba;
  DebugExpression<bool> local_3b9;
  undefined1 local_3b8 [7];
  DebugExpression<bool> _kjCondition_3;
  TestChild child3;
  TestChild child2;
  uint uStack_390;
  bool _kj_shouldLog_2;
  DebugExpression<int> local_38c;
  undefined1 local_388 [8];
  DebugComparison<int,_int> _kjCondition_2;
  undefined1 auStack_360 [4];
  bool _kj_shouldLog_1;
  DebugExpression<bool> _kjCondition_1;
  bool local_342;
  int status;
  bool _kj_shouldLog;
  uint local_330;
  bool local_322;
  DebugExpression<bool> local_321;
  undefined1 local_320 [7];
  DebugExpression<bool> _kjCondition;
  TestChild child1;
  WaitScope waitScope;
  EventLoop loop;
  UnixEventPort port;
  undefined1 local_178 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:895:3)>
  _kjDefer895;
  Fault f_2;
  SyscallResult local_14c;
  SyscallResult _kjSyscallResult_2;
  Fault f_1;
  SyscallResult local_138 [2];
  SyscallResult _kjSyscallResult_1;
  Fault local_128;
  Fault f;
  SyscallResult local_114;
  undefined1 local_110 [4];
  SyscallResult _kjSyscallResult;
  sigset_t oldsigs;
  sigset_t sigs;
  TestCase885 *this_local;
  
  if (((anonymous_namespace)::BROKEN_QEMU & 1) == 0) {
    captureSignals();
    f.exception = (Exception *)(oldsigs.__val + 0xf);
    local_114 = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase885::run()::__0>
                          ((anon_class_8_1_89918ac0 *)&f,false);
    pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_114);
    if (pvVar4 == (void *)0x0) {
      iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_114);
      kj::_::Debug::Fault::Fault
                (&local_128,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x37c,iVar2,"sigemptyset(&sigs)","");
      kj::_::Debug::Fault::fatal(&local_128);
    }
    f_1.exception = (Exception *)(oldsigs.__val + 0xf);
    local_138[0] = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase885::run()::__1>
                             ((anon_class_8_1_89918ac0 *)&f_1,false);
    pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(local_138);
    if (pvVar4 == (void *)0x0) {
      iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(local_138);
      kj::_::Debug::Fault::Fault
                ((Fault *)&stack0xfffffffffffffeb8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x37d,iVar2,"sigaddset(&sigs, SIGTERM)","");
      kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffeb8);
    }
    f_2.exception = (Exception *)(oldsigs.__val + 0xf);
    local_14c = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase885::run()::__2>
                          ((anon_class_16_2_7bf39872 *)&f_2,false);
    pvVar4 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_14c);
    if (pvVar4 == (void *)0x0) {
      iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_14c);
      kj::_::Debug::Fault::Fault
                ((Fault *)&_kjDefer895.maybeFunc.ptr.field_1.value,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x37e,iVar2,"pthread_sigmask(SIG_BLOCK, &sigs, &oldsigs)","");
      kj::_::Debug::Fault::fatal((Fault *)&_kjDefer895.maybeFunc.ptr.field_1.value);
    }
    port.childSet.ptr.ptr = (ChildSet *)local_110;
    defer<kj::(anonymous_namespace)::TestCase885::run()::__3>
              ((kj *)local_178,(Type *)&port.childSet.ptr.ptr);
    UnixEventPort::UnixEventPort((UnixEventPort *)&loop.currentlyFiring);
    EventLoop::EventLoop
              ((EventLoop *)&waitScope.runningStacksPool,(EventPort *)&loop.currentlyFiring);
    WaitScope::WaitScope((WaitScope *)&child1.promise,(EventLoop *)&waitScope.runningStacksPool);
    TestChild::TestChild((TestChild *)local_320,(UnixEventPort *)&loop.currentlyFiring,0x7b);
    SourceLocation::SourceLocation
              ((SourceLocation *)&status,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,"run",0x386,0x2c);
    iVar2 = Promise<int>::poll((Promise<int> *)&child1,(pollfd *)&child1.promise,__nfds,local_330);
    local_322 = (bool)(~(byte)iVar2 & 1);
    local_321 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_322);
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_321);
    iVar2 = extraout_EDX;
    if (!bVar1) {
      local_342 = kj::_::Debug::shouldLog(ERROR);
      uVar5 = extraout_RDX;
      while (iVar2 = (int)uVar5, local_342 != false) {
        kj::_::Debug::log<char_const(&)[49],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x386,ERROR,
                   "\"failed: expected \" \"!child1.promise.poll(waitScope)\", _kjCondition",
                   (char (*) [49])"failed: expected !child1.promise.poll(waitScope)",&local_321);
        uVar5 = extraout_RDX_00;
        local_342 = false;
      }
    }
    TestChild::kill((TestChild *)local_320,0xf,iVar2);
    SourceLocation::SourceLocation
              ((SourceLocation *)auStack_360,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,"run",0x38b,0x12);
    uVar3 = Promise<int>::wait((Promise<int> *)&child1,&child1.promise);
    _kjCondition_2._29_1_ = (uVar3 & 0x7f) == 0;
    _kjCondition_2._30_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_2.field_0x1d)
    ;
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                      ((DebugExpression *)&_kjCondition_2.field_0x1e);
    if (!bVar1) {
      _kjCondition_2._28_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_2._28_1_ != '\0') {
        kj::_::Debug::log<char_const(&)[35],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x38c,ERROR,"\"failed: expected \" \"WIFEXITED(status)\", _kjCondition",
                   (char (*) [35])"failed: expected WIFEXITED(status)",
                   (DebugExpression<bool> *)&_kjCondition_2.field_0x1e);
        _kjCondition_2._28_1_ = 0;
      }
    }
    uStack_390 = uVar3 >> 8 & 0xff;
    local_38c = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (int *)&stack0xfffffffffffffc70);
    child2.promise.super_PromiseBase.node.ptr._4_4_ = 0x7b;
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int> *)local_388,&local_38c,
               (int *)((long)&child2.promise.super_PromiseBase.node.ptr + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_388);
    if (!bVar1) {
      child2.promise.super_PromiseBase.node.ptr._3_1_ = kj::_::Debug::shouldLog(ERROR);
      while ((bool)child2.promise.super_PromiseBase.node.ptr._3_1_ != false) {
        kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x38d,ERROR,"\"failed: expected \" \"WEXITSTATUS(status) == 123\", _kjCondition"
                   ,(char (*) [44])"failed: expected WEXITSTATUS(status) == 123",
                   (DebugComparison<int,_int> *)local_388);
        child2.promise.super_PromiseBase.node.ptr._3_1_ = false;
      }
    }
    TestChild::TestChild((TestChild *)&child3.promise,(UnixEventPort *)&loop.currentlyFiring,0xea);
    TestChild::TestChild((TestChild *)local_3b8,(UnixEventPort *)&loop.currentlyFiring,0x159);
    SourceLocation::SourceLocation
              ((SourceLocation *)auStack_3d8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,"run",0x393,0x2c);
    iVar2 = Promise<int>::poll((Promise<int> *)&child2,(pollfd *)&child1.promise,__nfds_00,local_3c8
                              );
    local_3ba = (bool)(~(byte)iVar2 & 1);
    local_3b9 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3ba);
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_3b9);
    if (!bVar1) {
      local_3da = kj::_::Debug::shouldLog(ERROR);
      while (local_3da != false) {
        kj::_::Debug::log<char_const(&)[49],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x393,ERROR,
                   "\"failed: expected \" \"!child2.promise.poll(waitScope)\", _kjCondition",
                   (char (*) [49])"failed: expected !child2.promise.poll(waitScope)",&local_3b9);
        local_3da = false;
      }
    }
    SourceLocation::SourceLocation
              ((SourceLocation *)&status_1,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,"run",0x394,0x2c);
    iVar2 = Promise<int>::poll((Promise<int> *)&child3,(pollfd *)&child1.promise,__nfds_01,local_3e8
                              );
    local_3dc = (bool)(~(byte)iVar2 & 1);
    local_3db = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3dc);
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_3db);
    iVar2 = extraout_EDX_00;
    if (!bVar1) {
      local_3fa = kj::_::Debug::shouldLog(ERROR);
      uVar5 = extraout_RDX_01;
      while (iVar2 = (int)uVar5, local_3fa != false) {
        kj::_::Debug::log<char_const(&)[49],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x394,ERROR,
                   "\"failed: expected \" \"!child3.promise.poll(waitScope)\", _kjCondition",
                   (char (*) [49])"failed: expected !child3.promise.poll(waitScope)",&local_3db);
        uVar5 = extraout_RDX_02;
        local_3fa = false;
      }
    }
    TestChild::kill((TestChild *)&child3.promise,9,iVar2);
    SourceLocation::SourceLocation
              ((SourceLocation *)&uStack_418,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,"run",0x399,0x12);
    uVar3 = Promise<int>::wait((Promise<int> *)&child2,&child1.promise);
    _kjCondition_7._29_1_ = (uVar3 & 0x7f) != 0;
    _kjCondition_7._30_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_7.field_0x1d)
    ;
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                      ((DebugExpression *)&_kjCondition_7.field_0x1e);
    if (!bVar1) {
      _kjCondition_7._28_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_7._28_1_ != '\0') {
        kj::_::Debug::log<char_const(&)[36],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x39a,ERROR,"\"failed: expected \" \"!WIFEXITED(status)\", _kjCondition",
                   (char (*) [36])"failed: expected !WIFEXITED(status)",
                   (DebugExpression<bool> *)&_kjCondition_7.field_0x1e);
        _kjCondition_7._28_1_ = 0;
      }
    }
    _kjCondition_7._26_1_ = '\0' < (char)(((byte)uVar3 & 0x7f) + 1) >> 1;
    _kjCondition_7._27_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_7.field_0x1a)
    ;
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                      ((DebugExpression *)&_kjCondition_7.field_0x1b);
    if (!bVar1) {
      _kjCondition_7._25_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_7._25_1_ != '\0') {
        kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x39b,ERROR,"\"failed: expected \" \"WIFSIGNALED(status)\", _kjCondition",
                   (char (*) [37])"failed: expected WIFSIGNALED(status)",
                   (DebugExpression<bool> *)&_kjCondition_7.field_0x1b);
        _kjCondition_7._25_1_ = 0;
      }
    }
    uStack_448 = uVar3 & 0x7f;
    local_444 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (int *)&stack0xfffffffffffffbb8);
    local_44c = 9;
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int> *)local_440,&local_444,&local_44c);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_440);
    if (!bVar1) {
      local_44d = kj::_::Debug::shouldLog(ERROR);
      while (local_44d != false) {
        kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x39c,ERROR,
                   "\"failed: expected \" \"WTERMSIG(status) == SIGKILL\", _kjCondition",
                   (char (*) [45])"failed: expected WTERMSIG(status) == SIGKILL",
                   (DebugComparison<int,_int> *)local_440);
        local_44d = false;
      }
    }
    SourceLocation::SourceLocation
              ((SourceLocation *)auStack_468,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,"run",0x39f,0x2c);
    iVar2 = Promise<int>::poll((Promise<int> *)&child3,(pollfd *)&child1.promise,__nfds_02,local_458
                              );
    local_44f = (bool)(~(byte)iVar2 & 1);
    local_44e = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_44f);
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_44e);
    if (!bVar1) {
      local_46a = kj::_::Debug::shouldLog(ERROR);
      while (local_46a != false) {
        kj::_::Debug::log<char_const(&)[49],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x39f,ERROR,
                   "\"failed: expected \" \"!child3.promise.poll(waitScope)\", _kjCondition",
                   (char (*) [49])"failed: expected !child3.promise.poll(waitScope)",&local_44e);
        local_46a = false;
      }
    }
    TestChild::~TestChild((TestChild *)local_3b8);
    TestChild::~TestChild((TestChild *)&child3.promise);
    TestChild::~TestChild((TestChild *)local_320);
    WaitScope::~WaitScope((WaitScope *)&child1.promise);
    EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
    UnixEventPort::~UnixEventPort((UnixEventPort *)&loop.currentlyFiring);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:895:3)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:895:3)>
                 *)local_178);
  }
  return;
}

Assistant:

TEST(Async, ArrayJoinFailFastException) {
  EventLoop loop;
  WaitScope waitScope(loop);

  uint tasksCompleted = 0;
  auto pafs = makeCompletionCountingPafs(5, tasksCompleted);
  auto& fulfillers = pafs.fulfillers;
  Promise<void> promise = joinPromisesFailFast(kj::mv(pafs.promises));

  {
    uint i = 0;
    KJ_EXPECT(tasksCompleted == 0);

    // Joined tasks are completed eagerly, not waiting until the join node is awaited.
    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == i);

    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == i);

    fulfillers[i++]->reject(KJ_EXCEPTION(FAILED, "Test exception"));

    // The first rejection makes the promise ready.
    KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("Test exception", promise.wait(waitScope));
    KJ_EXPECT(tasksCompleted == i - 1);
  }
}